

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O2

err_t dstuPointGen(octet *point,dstu_params *params,gen_i rng,void *rng_state)

{
  word *a;
  word *stack;
  size_t sVar1;
  ec_o *ec_00;
  octet *poVar2;
  err_t eVar3;
  bool_t bVar4;
  qr_o *pqVar5;
  size_t pos;
  u64 *dest;
  word *b;
  ec_o *ec;
  octet *local_48;
  gen_i local_40;
  void *local_38;
  
  ec = (ec_o *)0x0;
  if (rng == (gen_i)0x0) {
    return 0x130;
  }
  local_40 = rng;
  local_38 = rng_state;
  eVar3 = dstuEcCreate(&ec,params,dstuPointGen_deep);
  ec_00 = ec;
  if (eVar3 == 0) {
    bVar4 = memIsValid(point,ec->f->no * 2);
    if (bVar4 == 0) {
      eVar3 = 0x6d;
    }
    else {
      dest = (u64 *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
      pqVar5 = ec_00->f;
      sVar1 = pqVar5->n;
      a = dest + sVar1;
      b = a + sVar1;
      stack = b + sVar1;
      local_48 = point;
      while( true ) {
        (*local_40)(dest,pqVar5->no,local_38);
        u64From(dest,dest,ec_00->f->no);
        sVar1 = ec_00->f->n;
        pos = gf2Deg(ec_00->f);
        wwTrimHi(dest,sVar1,pos);
        (*ec_00->f->sqr)(a,dest,ec_00->f,stack);
        (*ec_00->f->mul)(b,dest,a,ec_00->f,stack);
        bVar4 = wwIsZero(ec_00->A,ec_00->f->n);
        if (bVar4 == 0) {
          wwXor2(b,a,ec_00->f->n);
        }
        wwXor2(b,ec_00->B,ec_00->f->n);
        bVar4 = gf2QSolve(a,dest,b,ec_00->f,stack);
        if ((bVar4 != 0) &&
           (bVar4 = ecHasOrderA(dest,ec_00,ec_00->order,ec_00->f->n,stack), poVar2 = local_48,
           bVar4 != 0)) break;
        pqVar5 = ec_00->f;
      }
      (*ec_00->f->to)(local_48,dest,ec_00->f,stack);
      pqVar5 = ec_00->f;
      (*pqVar5->to)(poVar2 + pqVar5->no,a,pqVar5,stack);
      eVar3 = 0;
    }
    blobClose(ec_00);
    return eVar3;
  }
  return eVar3;
}

Assistant:

err_t dstuPointGen(octet point[], const dstu_params* params, gen_i rng, 
	void* rng_state)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	word* t;
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointGen_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	t = y + ec->f->n;
	stack = t + ec->f->n;
	// пока точка не сгенерирована
	while (1)
	{
		// сгенерировать x-координату
		// [алгоритм из раздела 6.4 ДСТУ --- обрезка x]
		rng(x, ec->f->no, rng_state);
		wwFrom(x, x, ec->f->no);
		wwTrimHi(x, ec->f->n, gf2Deg(ec->f));
		// y <- x^2
		qrSqr(y, x, ec->f, stack);
		// t <- x^3
		qrMul(t, x, y, ec->f, stack);
		// t <- x^3 + a x^2 + b
		if (!qrIsZero(ec->A, ec->f))
			gf2Add2(t, y, ec->f);
		gf2Add2(t, ec->B, ec->f);
		// y <- Solve[y^2 + x y == t], ord(x, y) == order?
		if (gf2QSolve(y, x, t, ec->f, stack) &&
			ecHasOrderA(x, ec, ec->order, ec->f->n, stack))
			break;
	}
	// выгрузить точку
	qrTo(point, x, ec->f, stack);
	qrTo(point + ec->f->no, y, ec->f, stack);
	// завершение
	dstuEcClose(ec);
	return ERR_OK;
}